

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# obj_model.c
# Opt level: O0

_Bool parse_mtl(FILE *fp,char *file_name,mtl_lib *mtl_lib)

{
  int iVar1;
  char *pcVar2;
  ushort **ppuVar3;
  size_t sVar4;
  long lVar5;
  void *__dest;
  float fVar6;
  mtl_material *material_4;
  mtl_material *material_3;
  mtl_material *material_2;
  mtl_material *material_1;
  mtl_material *material;
  mtl_material *local_460;
  char *material_name;
  char *base;
  char *ptr;
  long lStack_440;
  _Bool ok;
  size_t line_count;
  char line_buf [1024];
  anon_struct_24_3_5cfa0f82 materials;
  mtl_lib *mtl_lib_local;
  char *file_name_local;
  FILE *fp_local;
  
  memset(line_buf + 0x3f8,0,0x18);
  lStack_440 = 0;
  ptr._7_1_ = 1;
LAB_00109ab9:
  do {
    while( true ) {
      while( true ) {
        do {
          pcVar2 = fgets((char *)&line_count,0x400,(FILE *)fp);
          if (pcVar2 == (char *)0x0) {
            mtl_lib->materials = (mtl_material *)line_buf._1016_8_;
            mtl_lib->material_count = (size_t)materials.data;
            return (_Bool)(ptr._7_1_ & 1);
          }
          lStack_440 = lStack_440 + 1;
          base = skip_spaces((char *)&line_count);
        } while ((*base == '\0') || (*base == '#'));
        remove_spaces_after(base);
        iVar1 = strncmp(base,"newmtl",6);
        if ((iVar1 != 0) || (ppuVar3 = __ctype_b_loc(), ((*ppuVar3)[(int)base[6]] & 0x2000) == 0))
        break;
        material_name = skip_spaces(base + 7);
        base = material_name;
        base = skip_text(material_name);
        local_460 = (mtl_material *)copy_str_n(material_name,(long)base - (long)material_name);
        sVar4 = find_material((mtl_material *)line_buf._1016_8_,(size_t)materials.data,
                              (char *)local_460);
        if (sVar4 == 0) {
          fprintf(_stderr,"material \'%s\' redefined in %s, line %zu\n",local_460,file_name,
                  lStack_440);
          ptr._7_1_ = 0;
        }
        if (materials.size <= materials.data) {
          lVar5 = materials.size + 1;
          materials.size = lVar5 * 2;
          line_buf._1016_8_ = xrealloc((void *)line_buf._1016_8_,lVar5 * 0x110);
        }
        __dest = (void *)(line_buf._1016_8_ + (long)materials.data * 0x88);
        memset(&material,0,0x88);
        material = local_460;
        memcpy(__dest,&material,0x88);
        materials.data = (mtl_material *)((long)&(materials.data)->name + 1);
      }
      if (materials.data != (mtl_material *)0x0) break;
LAB_0010a664:
      fprintf(_stderr,"invalid MTL command \'%s\' in %s, line %zu\n",base,file_name,lStack_440);
      ptr._7_1_ = 0;
    }
    if (*base == 'K') {
      if ((base[1] == 'a') && (ppuVar3 = __ctype_b_loc(), ((*ppuVar3)[(int)base[2]] & 0x2000) != 0))
      {
        lVar5 = line_buf._1016_8_ + (long)((long)&materials.data[-1].map_d + 7) * 0x88;
        fVar6 = strtof(base + 3,&base);
        *(float *)(lVar5 + 8) = fVar6;
        fVar6 = strtof(base,&base);
        *(float *)(lVar5 + 0xc) = fVar6;
        fVar6 = strtof(base,&base);
        *(float *)(lVar5 + 0x10) = fVar6;
      }
      else if ((base[1] == 'd') &&
              (ppuVar3 = __ctype_b_loc(), ((*ppuVar3)[(int)base[2]] & 0x2000) != 0)) {
        lVar5 = line_buf._1016_8_ + (long)((long)&materials.data[-1].map_d + 7) * 0x88;
        fVar6 = strtof(base + 3,&base);
        *(float *)(lVar5 + 0x14) = fVar6;
        fVar6 = strtof(base,&base);
        *(float *)(lVar5 + 0x18) = fVar6;
        fVar6 = strtof(base,&base);
        *(float *)(lVar5 + 0x1c) = fVar6;
      }
      else if ((base[1] == 's') &&
              (ppuVar3 = __ctype_b_loc(), ((*ppuVar3)[(int)base[2]] & 0x2000) != 0)) {
        lVar5 = line_buf._1016_8_ + (long)((long)&materials.data[-1].map_d + 7) * 0x88;
        fVar6 = strtof(base + 3,&base);
        *(float *)(lVar5 + 0x20) = fVar6;
        fVar6 = strtof(base,&base);
        *(float *)(lVar5 + 0x24) = fVar6;
        fVar6 = strtof(base,&base);
        *(float *)(lVar5 + 0x28) = fVar6;
      }
      else {
        if ((base[1] != 'e') ||
           (ppuVar3 = __ctype_b_loc(), ((*ppuVar3)[(int)base[2]] & 0x2000) == 0)) goto LAB_0010a664;
        lVar5 = line_buf._1016_8_ + (long)((long)&materials.data[-1].map_d + 7) * 0x88;
        fVar6 = strtof(base + 3,&base);
        *(float *)(lVar5 + 0x2c) = fVar6;
        fVar6 = strtof(base,&base);
        *(float *)(lVar5 + 0x30) = fVar6;
        fVar6 = strtof(base,&base);
        *(float *)(lVar5 + 0x34) = fVar6;
      }
      goto LAB_00109ab9;
    }
    if (*base == 'N') {
      if ((base[1] == 's') && (ppuVar3 = __ctype_b_loc(), ((*ppuVar3)[(int)base[2]] & 0x2000) != 0))
      {
        fVar6 = strtof(base + 3,&base);
        *(float *)(line_buf._1016_8_ + (long)((long)&materials.data[-1].map_d + 7) * 0x88 + 0x38) =
             fVar6;
      }
      else {
        if ((base[1] != 'i') ||
           (ppuVar3 = __ctype_b_loc(), ((*ppuVar3)[(int)base[2]] & 0x2000) == 0)) goto LAB_0010a664;
        fVar6 = strtof(base + 3,&base);
        *(float *)(line_buf._1016_8_ + (long)((long)&materials.data[-1].map_d + 7) * 0x88 + 0x3c) =
             fVar6;
      }
    }
    else if (*base == 'T') {
      if ((base[1] == 'f') && (ppuVar3 = __ctype_b_loc(), ((*ppuVar3)[(int)base[2]] & 0x2000) != 0))
      {
        lVar5 = line_buf._1016_8_ + (long)((long)&materials.data[-1].map_d + 7) * 0x88;
        fVar6 = strtof(base + 3,&base);
        *(float *)(lVar5 + 0x40) = fVar6;
        fVar6 = strtof(base,&base);
        *(float *)(lVar5 + 0x44) = fVar6;
        fVar6 = strtof(base,&base);
        *(float *)(lVar5 + 0x48) = fVar6;
      }
      else {
        if ((base[1] != 'r') ||
           (ppuVar3 = __ctype_b_loc(), ((*ppuVar3)[(int)base[2]] & 0x2000) == 0)) goto LAB_0010a664;
        fVar6 = strtof(base + 3,&base);
        *(float *)(line_buf._1016_8_ + (long)((long)&materials.data[-1].map_d + 7) * 0x88 + 0x4c) =
             fVar6;
      }
    }
    else if ((*base == 'd') && (ppuVar3 = __ctype_b_loc(), ((*ppuVar3)[(int)base[1]] & 0x2000) != 0)
            ) {
      fVar6 = strtof(base + 2,&base);
      *(float *)(line_buf._1016_8_ + (long)((long)&materials.data[-1].map_d + 7) * 0x88 + 0x50) =
           fVar6;
    }
    else {
      iVar1 = strncmp(base,"illum",5);
      if ((iVar1 == 0) && (ppuVar3 = __ctype_b_loc(), ((*ppuVar3)[(int)base[5]] & 0x2000) != 0)) {
        fVar6 = strtof(base + 6,&base);
        *(int *)(line_buf._1016_8_ + (long)((long)&materials.data[-1].map_d + 7) * 0x88 + 0x54) =
             (int)fVar6;
      }
      else {
        iVar1 = strncmp(base,"map_Ka",6);
        if ((iVar1 == 0) && (ppuVar3 = __ctype_b_loc(), ((*ppuVar3)[(int)base[6]] & 0x2000) != 0)) {
          pcVar2 = skip_spaces(base + 7);
          pcVar2 = copy_str(pcVar2);
          *(char **)(line_buf._1016_8_ + (long)((long)&materials.data[-1].map_d + 7) * 0x88 + 0x58)
               = pcVar2;
        }
        else {
          iVar1 = strncmp(base,"map_Kd",6);
          if ((iVar1 == 0) && (ppuVar3 = __ctype_b_loc(), ((*ppuVar3)[(int)base[6]] & 0x2000) != 0))
          {
            pcVar2 = skip_spaces(base + 7);
            pcVar2 = copy_str(pcVar2);
            *(char **)(line_buf._1016_8_ + (long)((long)&materials.data[-1].map_d + 7) * 0x88 + 0x60
                      ) = pcVar2;
          }
          else {
            iVar1 = strncmp(base,"map_Ks",6);
            if ((iVar1 == 0) &&
               (ppuVar3 = __ctype_b_loc(), ((*ppuVar3)[(int)base[6]] & 0x2000) != 0)) {
              pcVar2 = skip_spaces(base + 7);
              pcVar2 = copy_str(pcVar2);
              *(char **)(line_buf._1016_8_ + (long)((long)&materials.data[-1].map_d + 7) * 0x88 +
                        0x68) = pcVar2;
            }
            else {
              iVar1 = strncmp(base,"map_Ke",6);
              if ((iVar1 == 0) &&
                 (ppuVar3 = __ctype_b_loc(), ((*ppuVar3)[(int)base[6]] & 0x2000) != 0)) {
                pcVar2 = skip_spaces(base + 7);
                pcVar2 = copy_str(pcVar2);
                *(char **)(line_buf._1016_8_ + (long)((long)&materials.data[-1].map_d + 7) * 0x88 +
                          0x70) = pcVar2;
              }
              else {
                iVar1 = strncmp(base,"map_bump",8);
                if ((iVar1 == 0) &&
                   (ppuVar3 = __ctype_b_loc(), ((*ppuVar3)[(int)base[8]] & 0x2000) != 0)) {
                  pcVar2 = skip_spaces(base + 9);
                  pcVar2 = copy_str(pcVar2);
                  *(char **)(line_buf._1016_8_ + (long)((long)&materials.data[-1].map_d + 7) * 0x88
                            + 0x78) = pcVar2;
                }
                else {
                  iVar1 = strncmp(base,"bump",4);
                  if ((iVar1 == 0) &&
                     (ppuVar3 = __ctype_b_loc(), ((*ppuVar3)[(int)base[4]] & 0x2000) != 0)) {
                    pcVar2 = skip_spaces(base + 5);
                    pcVar2 = copy_str(pcVar2);
                    *(char **)(line_buf._1016_8_ +
                               (long)((long)&materials.data[-1].map_d + 7) * 0x88 + 0x78) = pcVar2;
                  }
                  else {
                    iVar1 = strncmp(base,"map_d",5);
                    if ((iVar1 != 0) ||
                       (ppuVar3 = __ctype_b_loc(), ((*ppuVar3)[(int)base[5]] & 0x2000) == 0))
                    goto LAB_0010a664;
                    pcVar2 = skip_spaces(base + 6);
                    pcVar2 = copy_str(pcVar2);
                    *(char **)(line_buf._1016_8_ +
                               (long)((long)&materials.data[-1].map_d + 7) * 0x88 + 0x80) = pcVar2;
                  }
                }
              }
            }
          }
        }
      }
    }
  } while( true );
}

Assistant:

static bool parse_mtl(FILE* fp, const char* file_name, struct mtl_lib* mtl_lib) {
    ARRAY(struct mtl_material, materials)

    char line_buf[LINE_BUF_SIZE];
    size_t line_count = 0;
    bool ok = true;

    while (fgets(line_buf, LINE_BUF_SIZE, fp)) {
        line_count++;

        char* ptr = skip_spaces(line_buf);
        // Skip comments and empty lines
        if (*ptr == '\0' || *ptr == '#')
            continue;
        remove_spaces_after(ptr);

        if (!strncmp(ptr, "newmtl", 6) && isspace(ptr[6])) {
            ptr = skip_spaces(ptr + 7);
            char* base = ptr;
            ptr = skip_text(ptr);

            char* material_name = copy_str_n(base, ptr - base);
            if (!find_material(materials.data, materials.size, material_name)) {
                fprintf(stderr, "material '%s' redefined in %s, line %zu\n", material_name, file_name, line_count);
                ok = false;
            }
            PUSH(materials, (struct mtl_material) { .name = material_name });
        } else if (materials.size == 0) {
            goto invalid_command;
        } else if (ptr[0] == 'K') {
            if (ptr[1] == 'a' && isspace(ptr[2])) {
                struct mtl_material* material = &materials.data[materials.size - 1];
                material->ka.r = strtoreal(ptr + 3, &ptr);
                material->ka.g = strtoreal(ptr, &ptr);
                material->ka.b = strtoreal(ptr, &ptr);
            } else if (ptr[1] == 'd' && isspace(ptr[2])) {
                struct mtl_material* material = &materials.data[materials.size - 1];
                material->kd.r = strtoreal(ptr + 3, &ptr);
                material->kd.g = strtoreal(ptr, &ptr);
                material->kd.b = strtoreal(ptr, &ptr);
            } else if (ptr[1] == 's' && isspace(ptr[2])) {
                struct mtl_material* material = &materials.data[materials.size - 1];
                material->ks.r = strtoreal(ptr + 3, &ptr);
                material->ks.g = strtoreal(ptr, &ptr);
                material->ks.b = strtoreal(ptr, &ptr);
            } else if (ptr[1] == 'e' && isspace(ptr[2])) {
                struct mtl_material* material = &materials.data[materials.size - 1];
                material->ke.r = strtoreal(ptr + 3, &ptr);
                material->ke.g = strtoreal(ptr, &ptr);
                material->ke.b = strtoreal(ptr, &ptr);
            } else
                goto invalid_command;
        } else if (ptr[0] == 'N') {
            if (ptr[1] == 's' && isspace(ptr[2])) {
                materials.data[materials.size - 1].ns = strtoreal(ptr + 3, &ptr);
            } else if (ptr[1] == 'i' && isspace(ptr[2])) {
                materials.data[materials.size - 1].ni = strtoreal(ptr + 3, &ptr);
            } else
                goto invalid_command;
        } else if (ptr[0] == 'T') {
            if (ptr[1] == 'f' && isspace(ptr[2])) {
                struct mtl_material* material = &materials.data[materials.size - 1];
                material->tf.r = strtoreal(ptr + 3, &ptr);
                material->tf.g = strtoreal(ptr, &ptr);
                material->tf.b = strtoreal(ptr, &ptr);
            } else if (ptr[1] == 'r' && isspace(ptr[2])) {
                materials.data[materials.size - 1].tr = strtoreal(ptr + 3, &ptr);
            } else
                goto invalid_command;
        } else if (ptr[0] == 'd' && isspace(ptr[1])) {
            materials.data[materials.size - 1].d = strtoreal(ptr + 2, &ptr);
        } else if (!strncmp(ptr, "illum", 5) && isspace(ptr[5])) {
            materials.data[materials.size - 1].illum = strtoreal(ptr + 6, &ptr);
        } else if (!strncmp(ptr, "map_Ka", 6) && isspace(ptr[6])) {
            materials.data[materials.size - 1].map_ka = copy_str(skip_spaces(ptr + 7));
        } else if (!strncmp(ptr, "map_Kd", 6) && isspace(ptr[6])) {
            materials.data[materials.size - 1].map_kd = copy_str(skip_spaces(ptr + 7));
        } else if (!strncmp(ptr, "map_Ks", 6) && isspace(ptr[6])) {
            materials.data[materials.size - 1].map_ks = copy_str(skip_spaces(ptr + 7));
        } else if (!strncmp(ptr, "map_Ke", 6) && isspace(ptr[6])) {
            materials.data[materials.size - 1].map_ke = copy_str(skip_spaces(ptr + 7));
        } else if (!strncmp(ptr, "map_bump", 8) && isspace(ptr[8])) {
            materials.data[materials.size - 1].map_bump = copy_str(skip_spaces(ptr + 9));
        } else if (!strncmp(ptr, "bump", 4) && isspace(ptr[4])) {
            materials.data[materials.size - 1].map_bump = copy_str(skip_spaces(ptr + 5));
        } else if (!strncmp(ptr, "map_d", 5) && isspace(ptr[5])) {
            materials.data[materials.size - 1].map_d = copy_str(skip_spaces(ptr + 6));
        } else
            goto invalid_command;
        continue;
invalid_command:
        fprintf(stderr, "invalid MTL command '%s' in %s, line %zu\n", ptr, file_name, line_count);
        ok = false;
    }

    mtl_lib->materials = materials.data;
    mtl_lib->material_count = materials.size;

    return ok;
}